

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O2

string __thiscall mjs::global_object_impl::common_string(global_object_impl *this,char *str)

{
  gc_table *pgVar1;
  uint32_t uVar2;
  byte *pbVar3;
  slot *psVar4;
  gc_table *pgVar5;
  gc_table *pgVar6;
  gc_string *pgVar7;
  void *pvVar8;
  gc_heap **ppgVar9;
  uint32_t sz;
  char *__function;
  byte *in_RDX;
  ulong uVar10;
  gc_heap *extraout_RDX;
  gc_heap *pgVar11;
  gc_heap *extraout_RDX_00;
  char *__assertion;
  uint uVar12;
  uint uVar13;
  global_object_impl *this_00;
  ulong uVar14;
  string sVar15;
  uint local_64;
  undefined1 local_58 [16];
  global_object_impl *local_48;
  gc_table *local_40;
  byte *local_38;
  
  pgVar11 = *(gc_heap **)(str + 8);
  uVar12 = 0x811c9dc5;
  for (pbVar3 = in_RDX; *pbVar3 != 0; pbVar3 = pbVar3 + 1) {
    uVar12 = uVar12 * 0x1000193 ^ (uint)*pbVar3;
  }
  local_48 = this;
  psVar4 = gc_heap::allocation_context::get_at(&pgVar11->alloc_context_,*(int *)(str + 0x70) - 1);
  if (gc_type_info_registration<mjs::gc_vector<mjs::(anonymous_namespace)::string_cache::entry>>::
      reg._40_4_ != (psVar4->allocation).type) {
    __assert_fail("h.type_check<T>(pos_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                  0x1db,
                  "T &mjs::gc_heap_ptr_untracked<mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>>::dereference(gc_heap &) const [T = mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>, strong = true]"
                 );
  }
  psVar4 = gc_heap::allocation_context::get_at(&pgVar11->alloc_context_,*(uint32_t *)(str + 0x70));
  pgVar5 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                     ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)
                      &psVar4->allocation);
  pgVar1 = pgVar5 + 1;
  local_40 = pgVar5;
  local_64 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::length
                       ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)
                        &psVar4->allocation);
  local_38 = in_RDX;
  for (uVar13 = 0; uVar13 < local_64; uVar13 = uVar13 + 1) {
    pgVar6 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                       ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)
                        &psVar4->allocation);
    if (pgVar6->length_ <= uVar13) {
      __assertion = "index < tab().length()";
      __function = 
      "T &mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>::operator[](uint32_t) [T = mjs::(anonymous namespace)::string_cache::entry]"
      ;
      uVar12 = 0x19;
      goto LAB_00137967;
    }
    pgVar6 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                       ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)
                        &psVar4->allocation);
    uVar14 = (ulong)uVar13;
    if (*(int *)((long)&pgVar6[1].heap_ + uVar14 * 8 + 4) == 0) {
      pgVar6 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                         ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)
                          &psVar4->allocation);
      if (pgVar6->capacity_ <= uVar13) {
        __assert_fail("index < capacity()",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_vector.h"
                      ,0x87,
                      "void mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>::gc_table::erase(uint32_t) [T = mjs::(anonymous namespace)::string_cache::entry]"
                     );
      }
      memmove(&pgVar6[1].heap_ + uVar14,&pgVar6[1].capacity_ + uVar14 * 2,
              (ulong)(~uVar13 + pgVar6->length_) << 3);
      pgVar6->length_ = pgVar6->length_ - 1;
      uVar13 = uVar13 - 1;
      local_64 = local_64 - 1;
      in_RDX = local_38;
    }
    else if (*(uint *)(&pgVar1->heap_ + uVar14) == uVar12) {
      pgVar7 = gc_heap_ptr_untracked<mjs::gc_string,_false>::dereference
                         ((gc_heap_ptr_untracked<mjs::gc_string,_false> *)
                          ((long)&pgVar1->heap_ + uVar14 * 8 + 4),pgVar11);
      this_00 = local_48;
      for (uVar10 = 0; pgVar7->length_ != uVar10; uVar10 = uVar10 + 1) {
        if (pgVar7[uVar10 + 1].length_ != (int)(char)in_RDX[uVar10]) goto LAB_001377ac;
      }
      if (in_RDX[pgVar7->length_] == 0) goto LAB_00137903;
    }
LAB_001377ac:
  }
  local_58._0_8_ = strlen((char *)in_RDX);
  this_00 = local_48;
  local_58._8_8_ = in_RDX;
  string::string((string *)local_48,pgVar11,(string_view *)local_58);
  uVar2 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::length
                    ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)
                     &psVar4->allocation);
  pgVar6 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                     ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)
                      &psVar4->allocation);
  pgVar5 = local_40;
  if (uVar2 < pgVar6->capacity_) {
    pgVar6 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                       ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)
                        &psVar4->allocation);
    uVar2 = pgVar6->length_;
    if (uVar2 == pgVar6->capacity_) {
      if ((int)uVar2 < 0) {
        __assertion = "new_capacity >= length()";
        __function = 
        "gc_heap_ptr<gc_table> mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>::gc_table::copy_with_increased_capacity(uint32_t) const [T = mjs::(anonymous namespace)::string_cache::entry]"
        ;
        uVar12 = 0x6a;
        goto LAB_00137967;
      }
      gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::gc_table::make<>
                ((gc_table *)local_58,pgVar6->heap_,uVar2 * 2);
      pvVar8 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_58);
      if (*(uint *)((long)pvVar8 + 8) < pgVar6->length_) {
        __assertion = "new_length <= capacity_";
        __function = 
        "void mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>::gc_table::length(uint32_t) [T = mjs::(anonymous namespace)::string_cache::entry]"
        ;
        uVar12 = 0x73;
        goto LAB_00137967;
      }
      *(uint32_t *)((long)pvVar8 + 0xc) = pgVar6->length_;
      pvVar8 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_58);
      memcpy((void *)((long)pvVar8 + 0x10),pgVar6 + 1,(ulong)pgVar6->length_ << 3);
      psVar4[1].new_position = local_58._8_4_;
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_58);
    }
    pgVar6 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                       ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)
                        &psVar4->allocation);
    uVar13 = pgVar6->length_;
    if (pgVar6->capacity_ <= uVar13) {
      __assertion = "length() < capacity()";
      __function = 
      "void mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>::gc_table::push_back(const T &) [T = mjs::(anonymous namespace)::string_cache::entry]"
      ;
      uVar12 = 0x7c;
LAB_00137967:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_vector.h"
                    ,uVar12,__function);
    }
    pgVar6->length_ = uVar13 + 1;
    (&pgVar6[1].heap_)[uVar13] = (gc_heap *)0x0;
    pgVar6 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                       ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)
                        &psVar4->allocation);
    if (pgVar5 != pgVar6) {
      __assert_fail("es_data == es.data()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                    ,0x1ec,
                    "string mjs::(anonymous namespace)::string_cache::get(gc_heap &, const char *)")
      ;
    }
  }
  uVar2 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::length
                    ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)
                     &psVar4->allocation);
  ppgVar9 = &pgVar5[1].heap_ + (uVar2 - 1);
  pgVar11 = extraout_RDX;
  for (uVar13 = uVar2 - 2; uVar13 != 0xffffffff; uVar13 = uVar13 - 1) {
    pgVar11 = (&pgVar1->heap_)[uVar13];
    *ppgVar9 = pgVar11;
    ppgVar9 = ppgVar9 + -1;
  }
  pgVar1->heap_ =
       (gc_heap *)CONCAT44(*(undefined4 *)&(this_00->super_global_object).super_object.heap_,uVar12)
  ;
LAB_001378e4:
  sVar15.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = pgVar11;
  sVar15.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this_00;
  return (string)sVar15.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
LAB_00137903:
  while (uVar10 = uVar14 - 1, uVar10 != 0xffffffffffffffff) {
    pgVar11 = (&pgVar5[1].heap_)[uVar14];
    (&pgVar5[1].heap_)[uVar14] = (&pgVar1->heap_)[uVar10 & 0xffffffff];
    (&pgVar1->heap_)[uVar10 & 0xffffffff] = pgVar11;
    uVar14 = uVar10;
  }
  gc_heap_ptr_untracked<mjs::gc_string,_false>::track
            ((gc_heap_ptr_untracked<mjs::gc_string,_false> *)local_58,
             (gc_heap *)((long)&local_40[1].heap_ + 4));
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            ((gc_heap_ptr_untyped *)this_00,(gc_heap_ptr_untyped *)local_58);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_58);
  pgVar11 = extraout_RDX_00;
  goto LAB_001378e4;
}

Assistant:

string common_string(const char* str) override {
        return string_cache_.get(heap(), str);
    }